

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

int is_range_multiplier(char *s)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *in_RDI;
  int rval;
  uint local_c;
  char *local_8;
  
  ppuVar2 = __ctype_b_loc();
  if ((((*ppuVar2)[(int)*in_RDI] & 0x800) == 0) || (local_8 = in_RDI, *in_RDI == '0')) {
    local_c = 0;
  }
  else {
    do {
      ppuVar2 = __ctype_b_loc();
      pcVar3 = local_8 + 1;
      pcVar1 = local_8 + 1;
      local_8 = pcVar3;
    } while (((*ppuVar2)[(int)*pcVar1] & 0x800) != 0);
    local_c = (uint)(*pcVar3 == 'x');
  }
  return local_c;
}

Assistant:

static int is_range_multiplier(const char* s)
{
    int rval;
    if(isdigit(*s) && *s != '0')
    {
        while(isdigit(*++s)) ;
        rval = (*s == 'x');
    }
    else
        rval = 0;
    return rval;
}